

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opaque.c
# Opt level: O1

exr_result_t
exr_attr_opaquedata_set_packed(exr_context_t ctxt,exr_attr_opaquedata_t *u,void *packed,int32_t sz)

{
  exr_result_t eVar1;
  void *__dest;
  _func_exr_result_t_exr_const_context_t_exr_result_t *UNRECOVERED_JUMPTABLE;
  
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if (u == (exr_attr_opaquedata_t *)0x0) {
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eVar1 = 3;
  }
  else {
    if (sz < 0) {
      eVar1 = (*ctxt->print_error)
                        (ctxt,3,"Opaque data given invalid negative size (%d)",(ulong)(uint)sz,
                         ctxt->print_error);
      return eVar1;
    }
    __dest = (*ctxt->alloc_fn)((ulong)(uint)sz);
    if (__dest != (void *)0x0) {
      if ((u->unpacked_data != (void *)0x0) &&
         (u->destroy_unpacked_func_ptr != (_func_void_exr_context_t_void_ptr_int32_t *)0x0)) {
        (*u->destroy_unpacked_func_ptr)(ctxt,u->unpacked_data,u->unpacked_size);
      }
      u->unpacked_data = (void *)0x0;
      u->unpacked_size = 0;
      if (u->packed_data != (void *)0x0) {
        if (0 < u->packed_alloc_size) {
          (*ctxt->free_fn)(u->packed_data);
        }
        u->packed_data = (void *)0x0;
        u->size = 0;
        u->packed_alloc_size = 0;
      }
      u->packed_data = __dest;
      u->size = sz;
      u->packed_alloc_size = sz;
      if (packed == (void *)0x0) {
        return 0;
      }
      memcpy(__dest,packed,(ulong)(uint)sz);
      return 0;
    }
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eVar1 = 1;
  }
  eVar1 = (*UNRECOVERED_JUMPTABLE)(ctxt,eVar1);
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_opaquedata_set_packed (
    exr_context_t          ctxt,
    exr_attr_opaquedata_t* u,
    const void*            packed,
    int32_t                sz)
{
    void* nmem;
    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (!u) return ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT);

    /* TODO: do we care if the incoming unpacked data is null? */
    if (sz < 0)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Opaque data given invalid negative size (%d)",
            sz);

    nmem = ctxt->alloc_fn ((size_t) sz);
    if (!nmem) return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);

    if (u->unpacked_data)
    {
        if (u->destroy_unpacked_func_ptr)
            u->destroy_unpacked_func_ptr (
                ctxt, u->unpacked_data, u->unpacked_size);
    }
    u->unpacked_data = NULL;
    u->unpacked_size = 0;

    if (u->packed_data)
    {
        if (u->packed_alloc_size > 0) ctxt->free_fn (u->packed_data);
        u->packed_data       = NULL;
        u->size              = 0;
        u->packed_alloc_size = 0;
    }

    u->packed_data       = nmem;
    u->size              = sz;
    u->packed_alloc_size = sz;
    if (packed) memcpy ((void*) u->packed_data, packed, (size_t) sz);

    return EXR_ERR_SUCCESS;
}